

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlendCase::BlendCase
          (BlendCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
          *paramSets,bool useSrgbFbo)

{
  RenderTarget *pRVar1;
  int local_84;
  int local_64;
  bool useSrgbFbo_local;
  vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
  *paramSets_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BlendCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendCase_032987d0;
  std::
  vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
  ::vector(&this->m_paramSets,paramSets);
  this->m_curParamSetNdx = 0;
  this->m_useSrgbFbo = useSrgbFbo;
  this->m_colorRbo = 0;
  this->m_fbo = 0;
  this->m_renderer = (QuadRenderer *)0x0;
  this->m_referenceRenderer = (ReferenceQuadRenderer *)0x0;
  this->m_refColorBuffer = (TextureLevel *)0x0;
  deqp::gls::FragmentOpUtil::Quad::Quad(&this->m_firstQuad);
  deqp::gls::FragmentOpUtil::Quad::Quad(&this->m_secondQuad);
  deqp::gls::FragmentOpUtil::IntegerQuad::IntegerQuad(&this->m_firstQuadInt);
  deqp::gls::FragmentOpUtil::IntegerQuad::IntegerQuad(&this->m_secondQuadInt);
  if ((this->m_useSrgbFbo & 1U) == 0) {
    pRVar1 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    local_64 = tcu::RenderTarget::getWidth(pRVar1);
  }
  else {
    local_64 = 0x80;
  }
  this->m_renderWidth = local_64;
  if ((this->m_useSrgbFbo & 1U) == 0) {
    pRVar1 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    local_84 = tcu::RenderTarget::getHeight(pRVar1);
  }
  else {
    local_84 = 0x80;
  }
  this->m_renderHeight = local_84;
  this->m_viewportWidth = 0;
  this->m_viewportHeight = 0;
  return;
}

Assistant:

BlendCase::BlendCase (Context&						context,
					  const char*					name,
					  const char*					desc,
					  const vector<BlendParams>&	paramSets,
					  bool							useSrgbFbo)
	: TestCase				(context, name, desc)
	, m_paramSets			(paramSets)
	, m_curParamSetNdx		(0)
	, m_useSrgbFbo			(useSrgbFbo)
	, m_colorRbo			(0)
	, m_fbo					(0)
	, m_renderer			(DE_NULL)
	, m_referenceRenderer	(DE_NULL)
	, m_refColorBuffer		(DE_NULL)
	, m_renderWidth			(m_useSrgbFbo ? 2*MAX_VIEWPORT_WIDTH	: m_context.getRenderTarget().getWidth())
	, m_renderHeight		(m_useSrgbFbo ? 2*MAX_VIEWPORT_HEIGHT	: m_context.getRenderTarget().getHeight())
	, m_viewportWidth		(0)
	, m_viewportHeight		(0)
{
	DE_ASSERT(!m_paramSets.empty());
}